

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnSimdLaneOpExpr
          (BinaryReaderInterp *this,Opcode opcode,uint64_t value)

{
  Istream *this_00;
  bool bVar1;
  Enum op;
  Location local_48;
  Enum local_24;
  uint64_t local_20;
  uint64_t value_local;
  BinaryReaderInterp *this_local;
  Opcode opcode_local;
  
  local_20 = value;
  value_local = (uint64_t)this;
  this_local._0_4_ = opcode.enum_;
  GetLocation(&local_48,this);
  local_24 = (Enum)SharedValidator::OnSimdLaneOp
                             (&this->validator_,&local_48,this_local._0_4_,local_20);
  bVar1 = Failed((Result)local_24);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    this_00 = this->istream_;
    op = Opcode::operator_cast_to_Enum((Opcode *)&this_local);
    Istream::Emit(this_00,op,(u8)local_20);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnSimdLaneOpExpr(Opcode opcode, uint64_t value) {
  CHECK_RESULT(validator_.OnSimdLaneOp(GetLocation(), opcode, value));
  istream_.Emit(opcode, static_cast<u8>(value));
  return Result::Ok;
}